

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

FILE * Minisat::open_to_read_file(char *path)

{
  bool bVar1;
  int *in_RDI;
  FILE *file;
  FILE *path_00;
  char *in_stack_fffffffffffffff8;
  
  path_00 = (FILE *)0x0;
  bVar1 = has_suffix(in_stack_fffffffffffffff8,(char *)in_RDI);
  if (bVar1) {
    path_00 = (FILE *)read_pipe(in_stack_fffffffffffffff8,in_RDI,(char *)path_00);
  }
  if (path_00 == (FILE *)0x0) {
    bVar1 = has_suffix(in_stack_fffffffffffffff8,(char *)in_RDI);
    if (bVar1) {
      path_00 = (FILE *)read_pipe(in_stack_fffffffffffffff8,in_RDI,(char *)path_00);
    }
    if (path_00 == (FILE *)0x0) {
      bVar1 = has_suffix(in_stack_fffffffffffffff8,(char *)in_RDI);
      if (bVar1) {
        path_00 = (FILE *)read_pipe(in_stack_fffffffffffffff8,in_RDI,(char *)path_00);
      }
      if (path_00 == (FILE *)0x0) {
        bVar1 = has_suffix(in_stack_fffffffffffffff8,(char *)in_RDI);
        if (bVar1) {
          path_00 = (FILE *)read_pipe(in_stack_fffffffffffffff8,in_RDI,(char *)path_00);
        }
        if (path_00 == (FILE *)0x0) {
          bVar1 = has_suffix(in_stack_fffffffffffffff8,(char *)in_RDI);
          if (bVar1) {
            path_00 = (FILE *)read_pipe(in_stack_fffffffffffffff8,in_RDI,(char *)path_00);
          }
          if (path_00 == (FILE *)0x0) {
            path_00 = fopen((char *)in_RDI,"r");
          }
        }
      }
    }
  }
  return (FILE *)path_00;
}

Assistant:

inline FILE *open_to_read_file(const char *path)
{
    FILE *file = NULL;
#define READ_PIPE(SUFFIX, CMD, SIG)                                                                                    \
    do {                                                                                                               \
        if (has_suffix(path, SUFFIX)) {                                                                                \
            file = read_pipe(CMD, SIG, path);                                                                          \
        }                                                                                                              \
    } while (0)

    READ_PIPE(".bz2", "bzip2 -c -d %s", bz2sig);
    if (file) return file;
    READ_PIPE(".gz", "gzip -c -d %s", gzsig);
    if (file) return file;
    READ_PIPE(".lzma", "lzma -c -d %s", lzmasig);
    if (file) return file;
    READ_PIPE(".7z", "7z x -so %s 2>/dev/null", sig7z);
    if (file) return file;
    READ_PIPE(".xz", "xz -c -d %s", xzsig);
    if (file) return file;

    file = fopen(path, "r");
    return file;
}